

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O2

int_t mc64bd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int *iperm,int_t *num,int_t *jperm,
             int_t *pr,int_t *q,int_t *l,double *d__)

{
  uint *pos0;
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong extraout_RDX;
  ulong uVar10;
  int_t *piVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  int iVar18;
  double dVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  uint local_d4;
  uint *local_d0;
  uint local_c4;
  int_t *local_c0;
  double local_b8;
  int local_ac;
  uint local_a8;
  int_t c__1;
  int_t *local_a0;
  double local_98;
  int *local_90;
  int_t *local_88;
  int_t *local_80;
  double local_78;
  ulong local_70;
  double local_68;
  double *local_60;
  int_t *local_58;
  int local_50;
  int local_4c;
  double local_48;
  long local_40;
  ulong local_38;
  
  c__1 = 1;
  local_a0 = l + -1;
  local_c0 = pr + -1;
  local_88 = jperm + -1;
  local_80 = ip;
  dVar21 = dmach("Overflow");
  *num = 0;
  uVar8 = 0;
  uVar9 = (ulong)(uint)*n;
  uVar10 = extraout_RDX;
  if (*n < 1) {
    uVar9 = uVar8;
  }
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    iperm[uVar8] = 0;
    jperm[uVar8] = 0;
    uVar10 = (ulong)(uint)local_80[uVar8];
    pr[uVar8] = local_80[uVar8];
    d__[uVar8] = 0.0;
  }
  iVar5 = 0;
  if (0 < *n) {
    iVar5 = *n;
  }
  uVar9 = 1;
  while (uVar8 = uVar9, uVar8 != iVar5 + 1) {
    uVar9 = uVar8 + 1;
    iVar6 = local_80[uVar8];
    dVar22 = -1.0;
    for (lVar13 = (long)local_80[uVar8 - 1]; lVar13 < iVar6; lVar13 = lVar13 + 1) {
      uVar7 = irn[lVar13 + -1];
      dVar17 = a[lVar13 + -1];
      uVar20 = -(ulong)(-dVar17 <= dVar17);
      dVar17 = (double)(~uVar20 & (ulong)-dVar17 | (ulong)dVar17 & uVar20);
      if (d__[(long)(int)uVar7 + -1] <= dVar17 && dVar17 != d__[(long)(int)uVar7 + -1]) {
        d__[(long)(int)uVar7 + -1] = dVar17;
      }
      if (local_88[uVar8] == 0) {
        if (dVar21 <= dVar17) {
          dVar22 = dVar21;
          if (iperm[(long)(int)uVar7 + -1] == 0) {
            local_88[uVar8] = uVar7;
            iperm[(long)(int)uVar7 + -1] = (int)uVar8;
            *num = *num + 1;
          }
        }
        else if (dVar22 < dVar17) {
          uVar10 = (ulong)uVar7;
          dVar22 = dVar17;
        }
      }
    }
    if (((dVar22 != -1.0) || (NAN(dVar22))) && (dVar22 < dVar21)) {
      iVar6 = (int)uVar10;
      dVar21 = dVar22;
      if (iperm[(long)iVar6 + -1] == 0) {
        iperm[(long)iVar6 + -1] = (int)uVar8;
        local_88[uVar8] = iVar6;
        *num = *num + 1;
      }
    }
  }
  uVar7 = *n;
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar7) {
    uVar10 = (ulong)uVar7;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    if (d__[uVar9] <= dVar21) {
      dVar21 = d__[uVar9];
    }
  }
  if (*num != uVar7) {
    for (uVar9 = 1; uVar9 != (int)uVar10 + 1; uVar9 = uVar9 + 1) {
      if (local_88[uVar9] == 0) {
        iVar5 = local_80[uVar9];
        for (lVar13 = (long)local_80[uVar9 - 1]; lVar13 < iVar5; lVar13 = lVar13 + 1) {
          dVar22 = a[lVar13 + -1];
          uVar8 = -(ulong)(-dVar22 <= dVar22);
          if (dVar21 <= (double)(~uVar8 & (ulong)-dVar22 | (ulong)dVar22 & uVar8)) {
            iVar6 = irn[lVar13 + -1];
            iVar12 = iperm[(long)iVar6 + -1];
            lVar14 = (long)iVar12;
            if (lVar14 == 0) {
LAB_00110a2b:
              *num = *num + 1;
              local_88[uVar9] = iVar6;
              iperm[(long)iVar6 + -1] = (int)uVar9;
              local_c0[uVar9] = (int)lVar13 + 1;
              break;
            }
            iVar18 = local_c0[lVar14];
            lVar15 = (long)iVar18;
            iVar2 = local_80[lVar14];
            if (iVar18 < iVar2) {
              for (; iVar18 = iVar18 + 1, lVar15 < iVar2; lVar15 = lVar15 + 1) {
                iVar3 = irn[lVar15 + -1];
                if ((iperm[(long)iVar3 + -1] == 0) &&
                   (dVar22 = a[lVar15 + -1], uVar8 = -(ulong)(-dVar22 <= dVar22),
                   dVar21 <= (double)(~uVar8 & (ulong)-dVar22 | (ulong)dVar22 & uVar8))) {
                  local_88[lVar14] = iVar3;
                  iperm[(long)iVar3 + -1] = iVar12;
                  local_c0[lVar14] = iVar18;
                  goto LAB_00110a2b;
                }
              }
              local_c0[lVar14] = iVar2;
            }
          }
        }
      }
    }
    uVar7 = *n;
    if (*num != uVar7) {
      uVar10 = 0;
      uVar9 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar9 = uVar10;
      }
      uVar8 = (ulong)((int)uVar9 + 1);
      for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        d__[uVar10] = -1.0;
        l[uVar10] = 0;
      }
      iVar5 = *n;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      uVar9 = (ulong)(iVar5 + 1);
      piVar11 = local_a0;
      local_d0 = (uint *)n;
      local_90 = iperm;
      local_60 = a;
      local_58 = irn;
      local_38 = uVar9;
      for (local_70 = 1; local_70 != uVar9; local_70 = local_70 + 1) {
        if (local_88[local_70] == 0) {
          uVar7 = *local_d0;
          dVar17 = (double)(ulong)(uVar7 + 1);
          local_c0[local_70] = -1;
          dVar19 = (double)(long)local_80[local_70];
          lVar13 = (long)local_80[local_70 - 1];
          local_b8 = (double)((ulong)local_b8 & 0xffffffff00000000);
          local_98 = -1.0;
          dVar22 = dVar17;
          local_78 = dVar21;
          local_68 = dVar19;
LAB_00110b2c:
          if (lVar13 < (long)dVar19) {
            uVar4 = irn[lVar13 + -1];
            uVar8 = (ulong)uVar4;
            dVar16 = a[lVar13 + -1];
            uVar9 = -(ulong)(-dVar16 <= dVar16);
            dVar16 = (double)(~uVar9 & (ulong)-dVar16 | (ulong)dVar16 & uVar9);
            local_c4 = uVar4;
            if (dVar16 <= local_98) goto LAB_00110c54;
            if (iperm[(long)(int)uVar4 + -1] != 0) {
              d__[(long)(int)uVar4 + -1] = dVar16;
              if (dVar21 <= dVar16) {
                iVar5 = SUB84(dVar22,0);
                dVar22 = (double)(ulong)(iVar5 - 1);
                q[(long)iVar5 + -2] = uVar4;
              }
              else {
                iVar5 = local_b8._0_4_ + 1;
                local_b8 = (double)CONCAT44(local_b8._4_4_,iVar5);
                l[(long)(int)uVar4 + -1] = iVar5;
                mc64dd_((int_t *)&local_c4,(int_t *)local_d0,q,d__,l,&c__1);
                piVar11 = local_a0;
                iperm = local_90;
                irn = local_58;
                dVar19 = local_68;
                dVar21 = local_78;
              }
              local_c0[iperm[(long)(int)uVar4 + -1]] = (int_t)local_70;
              goto LAB_00110c54;
            }
            local_ac = (int)local_70;
            local_98 = dVar16;
            local_a8 = uVar4;
            if (dVar16 < dVar21) goto LAB_00110c54;
            local_d4 = local_b8._0_4_;
LAB_00111062:
            iVar5 = SUB84(dVar17,0);
            local_98 = dVar16;
            goto LAB_00111074;
          }
          local_d4 = local_b8._0_4_;
          local_50 = *num;
          dVar17 = (double)(long)(int)(uVar7 + 1);
          if (local_50 < 1) {
            local_50 = 0;
          }
          local_50 = local_50 + 1;
          iVar5 = 1;
          while (iVar5 != local_50) {
            local_4c = iVar5;
            if (SUB84(dVar22,0) == SUB84(dVar17,0)) {
              if (local_d4 != 0) {
                uVar8 = (ulong)*q;
                dVar19 = d__[uVar8 - 1];
                if (local_98 < dVar19) {
                  dVar22 = (double)(long)SUB84(dVar22,0);
                  uVar7 = *local_d0;
                  local_b8 = dVar19;
                  if ((int)*local_d0 < 1) {
                    uVar7 = 0;
                  }
                  while( true ) {
                    dVar19 = (double)((long)dVar22 - 1);
                    dVar21 = local_b8;
                    if (uVar7 == 0) break;
                    mc64ed_((int_t *)&local_d4,(int_t *)local_d0,q,d__,l,&c__1);
                    l[(long)(int)uVar8 + -1] = 0;
                    q[(long)dVar22 - 2] = (int)uVar8;
                    piVar11 = local_a0;
                    dVar22 = dVar19;
                    iperm = local_90;
                    irn = local_58;
                    a = local_60;
                    dVar21 = local_b8;
                    if (local_d4 == 0) break;
                    uVar8 = (ulong)*q;
                    if ((d__[uVar8 - 1] != local_b8) ||
                       (uVar7 = uVar7 - 1, NAN(d__[uVar8 - 1]) || NAN(local_b8))) break;
                  }
                  goto LAB_00110dce;
                }
              }
              dVar17 = (double)((ulong)dVar22 & 0xffffffff);
              break;
            }
LAB_00110dce:
            lVar13 = (long)q[(long)dVar17 - 2];
            dVar17 = (double)((long)dVar17 - 1);
            dVar19 = d__[lVar13 + -1];
            piVar11[lVar13] = SUB84(dVar17,0);
            lVar13 = (long)iperm[lVar13 + -1];
            iVar5 = local_80[lVar13];
            local_b8 = dVar21;
            local_68 = dVar17;
            local_48 = dVar19;
            local_40 = lVar13;
            for (lVar14 = (long)local_80[lVar13 + -1]; lVar14 < iVar5; lVar14 = lVar14 + 1) {
              uVar7 = irn[lVar14 + -1];
              uVar8 = (ulong)uVar7;
              local_c4 = uVar7;
              if ((long)piVar11[(int)uVar7] < (long)dVar17) {
                dVar16 = a[lVar14 + -1];
                uVar9 = -(ulong)(-dVar16 <= dVar16);
                dVar1 = (double)(~uVar9 & (ulong)-dVar16 | (ulong)dVar16 & uVar9);
                dVar16 = dVar19;
                if (dVar1 <= dVar19) {
                  dVar16 = dVar1;
                }
                if (local_98 < dVar16) {
                  if (iperm[(long)(int)uVar7 + -1] == 0) {
                    local_ac = (int)lVar13;
                    local_98 = dVar16;
                    local_a8 = uVar7;
                    if (dVar21 <= dVar16) goto LAB_00111062;
                  }
                  else {
                    dVar1 = d__[(long)(int)uVar7 + -1];
                    if ((dVar1 < dVar21) && (dVar1 < dVar16)) {
                      pos0 = (uint *)(piVar11 + (int)uVar7);
                      d__[(long)(int)uVar7 + -1] = dVar16;
                      if (dVar21 <= dVar16) {
                        if ((dVar1 != -1.0) || (dVar16 = dVar22, NAN(dVar1))) {
                          local_78 = dVar22;
                          mc64fd_((int_t *)pos0,(int_t *)&local_d4,(int_t *)local_d0,q,d__,l,&c__1);
                          lVar13 = local_40;
                          piVar11 = local_a0;
                          dVar16 = local_78;
                          dVar17 = local_68;
                          a = local_60;
                          dVar21 = local_b8;
                          dVar19 = local_48;
                        }
                        *pos0 = 0;
                        dVar22 = (double)(ulong)(SUB84(dVar16,0) - 1);
                        q[(long)SUB84(dVar16,0) + -2] = uVar7;
                      }
                      else {
                        if ((dVar1 == -1.0) && (!NAN(dVar1))) {
                          local_d4 = local_d4 + 1;
                          *pos0 = local_d4;
                        }
                        local_78 = dVar22;
                        mc64dd_((int_t *)&local_c4,(int_t *)local_d0,q,d__,l,&c__1);
                        lVar13 = local_40;
                        piVar11 = local_a0;
                        dVar22 = local_78;
                        dVar17 = local_68;
                        dVar21 = local_b8;
                        dVar19 = local_48;
                      }
                      local_c0[local_90[(long)(int)uVar7 + -1]] = (int_t)lVar13;
                      iperm = local_90;
                    }
                  }
                }
              }
            }
            iVar5 = local_4c + 1;
          }
          iVar5 = SUB84(dVar17,0);
LAB_00111074:
          if ((local_98 != -1.0) || (NAN(local_98))) {
            if (local_98 <= dVar21) {
              dVar21 = local_98;
            }
            iVar6 = *num;
            *num = iVar6 + 1;
            if (iVar6 < -1) {
              iVar6 = -2;
            }
            iVar6 = iVar6 + 3;
            uVar7 = local_a8;
            iVar12 = local_ac;
            do {
              uVar8 = (ulong)uVar7;
              iVar6 = iVar6 + -1;
              if (iVar6 == 0) break;
              uVar4 = local_88[iVar12];
              local_88[iVar12] = uVar7;
              iperm[(long)(int)uVar7 + -1] = iVar12;
              iVar12 = local_c0[iVar12];
              piVar11 = local_a0;
              uVar7 = uVar4;
            } while (iVar12 != -1);
          }
          uVar7 = *local_d0;
          for (lVar13 = (long)iVar5; lVar13 <= (int)uVar7; lVar13 = lVar13 + 1) {
            uVar8 = (ulong)q[lVar13 + -1];
            d__[uVar8 - 1] = -1.0;
            piVar11[uVar8] = 0;
          }
          for (lVar13 = (long)SUB84(dVar22,0); lVar13 < iVar5; lVar13 = lVar13 + 1) {
            uVar8 = (ulong)q[lVar13 + -1];
            d__[uVar8 - 1] = -1.0;
          }
          uVar9 = (ulong)local_d4;
          if ((int)local_d4 < 1) {
            uVar9 = 0;
          }
          for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
            uVar8 = (ulong)q[uVar10];
            d__[uVar8 - 1] = -1.0;
            piVar11[uVar8] = 0;
          }
          local_c4 = (uint)uVar8;
          uVar9 = local_38;
        }
      }
      uVar7 = *local_d0;
      if (*num != uVar7) {
        uVar10 = 0;
        uVar9 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar9 = uVar10;
        }
        for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          jperm[uVar10] = 0;
        }
        uVar10 = 0;
        uVar9 = (ulong)*local_d0;
        if ((int)*local_d0 < 1) {
          uVar9 = uVar10;
        }
        iVar5 = 0;
        while (uVar9 != uVar10) {
          iVar12 = iVar5 + 1;
          piVar11 = local_88;
          iVar6 = iperm[uVar10];
          if (iperm[uVar10] == 0) {
            iVar5 = iVar12;
            piVar11 = local_c0;
            iVar6 = iVar12;
          }
          uVar10 = uVar10 + 1;
          piVar11[iVar6] = (int_t)uVar10;
        }
        uVar10 = 0;
        uVar9 = (ulong)*local_d0;
        if ((int)*local_d0 < 1) {
          uVar9 = uVar10;
        }
        iVar5 = 0;
        for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          if (jperm[uVar10] == 0) {
            lVar13 = (long)iVar5;
            iVar5 = iVar5 + 1;
            iperm[(long)local_c0[lVar13 + 1] + -1] = (int)uVar10 + 1;
          }
        }
      }
    }
  }
  return 0;
LAB_00110c54:
  lVar13 = lVar13 + 1;
  goto LAB_00110b2c;
}

Assistant:

int_t mc64bd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a, int *iperm, int_t *num, int_t *jperm, 
	int_t *pr, int_t *q, int_t *l, double *d__)
{
    /* System generated locals */
    int_t i__1, i__2, i__3;
    double d__1, d__2, d__3;
    int_t c__1 = 1;

    /* Local variables */
    int_t i__, j, k;
    double a0;
    int_t i0, q0;
    double ai, di;
    int_t ii, jj, kk;
    double bv;
    int_t up;
    double dq0;
    int_t kk1, kk2;
    double csp;
    int_t isp, jsp, low;
    double dnew;
    int_t jord, qlen, idum, jdum;
    double rinf;
    extern /* Subroutine */ int_t
	mc64dd_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64ed_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64fd_(int_t *, int_t *, int_t *, int_t *, double *, int_t *, int_t *);


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* N, NE, IP, IRN are described in MC64A/AD. */
/* A is a REAL (DOUBLE PRECISION in the D-version) array of length */
/*   NE. A(K), K=1..NE, must be set to the value of the entry */
/*   that corresponds to IRN(K). It is not altered. */
/* IPERM is an INT_T array of length N. On exit, it contains the */
/*    matching: IPERM(I) = 0 or row I is matched to column IPERM(I). */
/* NUM is INT_T variable. On exit, it contains the cardinality of the */
/*    matching stored in IPERM. */
/* IW is an INT_T work array of length 4N. */
/* DW is a REAL (DOUBLE PRECISION in D-version) work array of length N. */
/* Local variables */
/* Local parameters */
/* Intrinsic functions */
/* External subroutines and/or functions */
/*      EXTERNAL FD05AD,MC64DD,MC64ED,MC64FD, DMACH */
/*      DOUBLE PRECISION FD05AD, DMACH */
/* Set RINF to largest positive real number */
/* XSL  RINF = FD05AD(5) */
    /* Parameter adjustments */
    --d__;
    --l;
    --q;
    --pr;
    --jperm;
    --iperm;
    --ip;
    --a;
    --irn;

    /* Function Body */
    rinf = dmach("Overflow");
/* Initialization */
    *num = 0;
    bv = rinf;
    i__1 = *n;
    for (k = 1; k <= i__1; ++k) {
	iperm[k] = 0;
	jperm[k] = 0;
	pr[k] = ip[k];
	d__[k] = 0.;
/* L10: */
    }
/* Scan columns of matrix; */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	a0 = -1.;
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    ai = (d__1 = a[k], abs(d__1));
	    if (ai > d__[i__]) {
		d__[i__] = ai;
	    }
	    if (jperm[j] != 0) {
		goto L30;
	    }
	    if (ai >= bv) {
		a0 = bv;
		if (iperm[i__] != 0) {
		    goto L30;
		}
		jperm[j] = i__;
		iperm[i__] = j;
		++(*num);
	    } else {
		if (ai <= a0) {
		    goto L30;
		}
		a0 = ai;
		i0 = i__;
	    }
L30:
	    ;
	}
	if (a0 != -1. && a0 < bv) {
	    bv = a0;
	    if (iperm[i0] != 0) {
		goto L20;
	    }
	    iperm[i0] = j;
	    jperm[j] = i0;
	    ++(*num);
	}
L20:
	;
    }
/* Update BV with smallest of all the largest maximum absolute values */
/* of the rows. */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
/* Computing MIN */
	d__1 = bv, d__2 = d__[i__];
	bv = min(d__1,d__2);
/* L25: */
    }
    if (*num == *n) {
	goto L1000;
    }
/* Rescan unassigned columns; improve initial assignment */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (jperm[j] != 0) {
	    goto L95;
	}
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    ai = (d__1 = a[k], abs(d__1));
	    if (ai < bv) {
		goto L50;
	    }
	    if (iperm[i__] == 0) {
		goto L90;
	    }
	    jj = iperm[i__];
	    kk1 = pr[jj];
	    kk2 = ip[jj + 1] - 1;
	    if (kk1 > kk2) {
		goto L50;
	    }
	    i__3 = kk2;
	    for (kk = kk1; kk <= i__3; ++kk) {
		ii = irn[kk];
		if (iperm[ii] != 0) {
		    goto L70;
		}
		if ((d__1 = a[kk], abs(d__1)) >= bv) {
		    goto L80;
		}
L70:
		;
	    }
	    pr[jj] = kk2 + 1;
L50:
	    ;
	}
	goto L95;
L80:
	jperm[jj] = ii;
	iperm[ii] = jj;
	pr[jj] = kk + 1;
L90:
	++(*num);
	jperm[j] = i__;
	iperm[i__] = j;
	pr[j] = k + 1;
L95:
	;
    }
    if (*num == *n) {
	goto L1000;
    }
/* Prepare for main loop */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	d__[i__] = -1.;
	l[i__] = 0;
/* L99: */
    }
/* Main loop ... each pass round this loop is similar to Dijkstra's */
/* algorithm for solving the single source shortest path problem */
    i__1 = *n;
    for (jord = 1; jord <= i__1; ++jord) {
	if (jperm[jord] != 0) {
	    goto L100;
	}
	qlen = 0;
	low = *n + 1;
	up = *n + 1;
/* CSP is cost of shortest path to any unassigned row */
/* ISP is matrix position of unassigned row element in shortest path */
/* JSP is column index of unassigned row element in shortest path */
	csp = -1.;
/* Build shortest path tree starting from unassigned column JORD */
	j = jord;
	pr[j] = -1;
/* Scan column J */
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    dnew = (d__1 = a[k], abs(d__1));
	    if (csp >= dnew) {
		goto L115;
	    }
	    if (iperm[i__] == 0) {
/* Row I is unassigned; update shortest path info */
		csp = dnew;
		isp = i__;
		jsp = j;
		if (csp >= bv) {
		    goto L160;
		}
	    } else {
		d__[i__] = dnew;
		if (dnew >= bv) {
/* Add row I to Q2 */
		    --low;
		    q[low] = i__;
		} else {
/* Add row I to Q, and push it */
		    ++qlen;
		    l[i__] = qlen;
		    mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__1);
		}
		jj = iperm[i__];
		pr[jj] = j;
	    }
L115:
	    ;
	}
	i__2 = *num;
	for (jdum = 1; jdum <= i__2; ++jdum) {
/* If Q2 is empty, extract new rows from Q */
	    if (low == up) {
		if (qlen == 0) {
		    goto L160;
		}
		i__ = q[1];
		if (csp >= d__[i__]) {
		    goto L160;
		}
		bv = d__[i__];
		i__3 = *n;
		for (idum = 1; idum <= i__3; ++idum) {
		    mc64ed_(&qlen, n, &q[1], &d__[1], &l[1], &c__1);
		    l[i__] = 0;
		    --low;
		    q[low] = i__;
		    if (qlen == 0) {
			goto L153;
		    }
		    i__ = q[1];
		    if (d__[i__] != bv) {
			goto L153;
		    }
/* L152: */
		}
/* End of dummy loop; this point is never reached */
	    }
/* Move row Q0 */
L153:
	    --up;
	    q0 = q[up];
	    dq0 = d__[q0];
	    l[q0] = up;
/* Scan column that matches with row Q0 */
	    j = iperm[q0];
	    i__3 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__3; ++k) {
		i__ = irn[k];
/* Update D(I) */
		if (l[i__] >= up) {
		    goto L155;
		}
/* Computing MIN */
		d__2 = dq0, d__3 = (d__1 = a[k], abs(d__1));
		dnew = min(d__2,d__3);
		if (csp >= dnew) {
		    goto L155;
		}
		if (iperm[i__] == 0) {
/* Row I is unassigned; update shortest path info */
		    csp = dnew;
		    isp = i__;
		    jsp = j;
		    if (csp >= bv) {
			goto L160;
		    }
		} else {
		    di = d__[i__];
		    if (di >= bv || di >= dnew) {
			goto L155;
		    }
		    d__[i__] = dnew;
		    if (dnew >= bv) {
/* Delete row I from Q (if necessary); add row I to Q2 */
			if (di != -1.) {
			    mc64fd_(&l[i__], &qlen, n, &q[1], &d__[1], &l[1], 
				    &c__1);
			}
			l[i__] = 0;
			--low;
			q[low] = i__;
		    } else {
/* Add row I to Q (if necessary); push row I up Q */
			if (di == -1.) {
			    ++qlen;
			    l[i__] = qlen;
			}
			mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__1);
		    }
/* Update tree */
		    jj = iperm[i__];
		    pr[jj] = j;
		}
L155:
		;
	    }
/* L150: */
	}
/* If CSP = MINONE, no augmenting path is found */
L160:
	if (csp == -1.) {
	    goto L190;
	}
/* Update bottleneck value */
	bv = min(bv,csp);
/* Find augmenting path by tracing backward in PR; update IPERM,JPERM */
	++(*num);
	i__ = isp;
	j = jsp;
	i__2 = *num + 1;
	for (jdum = 1; jdum <= i__2; ++jdum) {
	    i0 = jperm[j];
	    jperm[j] = i__;
	    iperm[i__] = j;
	    j = pr[j];
	    if (j == -1) {
		goto L190;
	    }
	    i__ = i0;
/* L170: */
	}
/* End of dummy loop; this point is never reached */
L190:
	i__2 = *n;
	for (kk = up; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = -1.;
	    l[i__] = 0;
/* L191: */
	}
	i__2 = up - 1;
	for (kk = low; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = -1.;
/* L192: */
	}
	i__2 = qlen;
	for (kk = 1; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = -1.;
	    l[i__] = 0;
/* L193: */
	}
L100:
	;
    }
/* End of main loop */
/* BV is bottleneck value of final matching */
    if (*num == *n) {
	goto L1000;
    }
/* Matrix is structurally singular, complete IPERM. */
/* JPERM, PR are work arrays */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	jperm[j] = 0;
/* L300: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (iperm[i__] == 0) {
	    ++k;
	    pr[k] = i__;
	} else {
	    j = iperm[i__];
	    jperm[j] = i__;
	}
/* L310: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (jperm[i__] != 0) {
	    goto L320;
	}
	++k;
	jdum = pr[k];
	iperm[jdum] = i__;
L320:
	;
    }
L1000:
    return 0;
}